

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtDecide.c
# Opt level: O3

void Cgt_ManCollectFanoutPos_rec(Aig_Man_t *pAig,Aig_Obj_t *pObj,Vec_Ptr_t *vFanout)

{
  Vec_Ptr_t *pVVar1;
  void **ppvVar2;
  int iVar3;
  uint uVar4;
  Aig_Obj_t *pObj_00;
  uint uVar5;
  uint uVar6;
  
  if (pObj->TravId != pAig->nTravIds) {
    pObj->TravId = pAig->nTravIds;
    if (((uint)*(ulong *)&pObj->field_0x18 & 7) == 3) {
      uVar6 = vFanout->nSize;
      if (uVar6 == vFanout->nCap) {
        if ((int)uVar6 < 0x10) {
          if (vFanout->pArray == (void **)0x0) {
            ppvVar2 = (void **)malloc(0x80);
          }
          else {
            ppvVar2 = (void **)realloc(vFanout->pArray,0x80);
          }
          vFanout->pArray = ppvVar2;
          vFanout->nCap = 0x10;
        }
        else {
          if (vFanout->pArray == (void **)0x0) {
            ppvVar2 = (void **)malloc((ulong)uVar6 << 4);
          }
          else {
            ppvVar2 = (void **)realloc(vFanout->pArray,(ulong)uVar6 << 4);
          }
          vFanout->pArray = ppvVar2;
          vFanout->nCap = uVar6 * 2;
        }
      }
      else {
        ppvVar2 = vFanout->pArray;
      }
      iVar3 = vFanout->nSize;
      vFanout->nSize = iVar3 + 1;
      ppvVar2[iVar3] = pObj;
    }
    else {
      if (pAig->pFanData == (int *)0x0) {
        __assert_fail("pAig->pFanData",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/cgt/cgtDecide.c"
                      ,0x40,
                      "void Cgt_ManCollectFanoutPos_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
      }
      if ((*(ulong *)&pObj->field_0x18 & 0xffffffc0) != 0) {
        uVar5 = 0;
        uVar6 = 0xffffffff;
        do {
          if (uVar5 == 0) {
            if (pAig->nFansAlloc <= pObj->Id) {
              __assert_fail("ObjId < p->nFansAlloc",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                            ,0x1a8,"int Aig_ObjFanout0Int(Aig_Man_t *, int)");
            }
            iVar3 = pObj->Id * 5;
          }
          else {
            if (pAig->nFansAlloc <= (int)uVar6 / 2) {
              __assert_fail("iFan/2 < p->nFansAlloc",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                            ,0x1a9,"int Aig_ObjFanoutNext(Aig_Man_t *, int)");
            }
            iVar3 = ((int)uVar6 >> 1) * 5 + (uVar6 & 1) + 3;
          }
          pVVar1 = pAig->vObjs;
          uVar6 = pAig->pFanData[iVar3];
          if (pVVar1 == (Vec_Ptr_t *)0x0) {
            pObj_00 = (Aig_Obj_t *)0x0;
          }
          else {
            uVar4 = (int)uVar6 >> 1;
            if (((int)uVar4 < 0) || (pVVar1->nSize <= (int)uVar4)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            pObj_00 = (Aig_Obj_t *)pVVar1->pArray[uVar4];
          }
          Cgt_ManCollectFanoutPos_rec(pAig,pObj_00,vFanout);
          uVar5 = uVar5 + 1;
        } while (uVar5 < *(uint *)&pObj->field_0x18 >> 6);
      }
    }
  }
  return;
}

Assistant:

void Cgt_ManCollectFanoutPos_rec( Aig_Man_t * pAig, Aig_Obj_t * pObj, Vec_Ptr_t * vFanout )
{
    Aig_Obj_t * pFanout;
    int f, iFanout = -1;
    if ( Aig_ObjIsTravIdCurrent(pAig, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(pAig, pObj);
    if ( Aig_ObjIsCo(pObj) )
    {
        Vec_PtrPush( vFanout, pObj );
        return;
    }
    Aig_ObjForEachFanout( pAig, pObj, pFanout, iFanout, f )
        Cgt_ManCollectFanoutPos_rec( pAig, pFanout, vFanout );
}